

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

ly_bool node_has_printable_meta(lyd_node *node)

{
  ly_bool lVar1;
  lyd_meta *meta;
  
  meta = node->meta;
  if (meta != (lyd_meta *)0x0) {
    for (; meta != (lyd_meta *)0x0; meta = meta->next) {
      lVar1 = lyd_metadata_should_print(meta);
      if (lVar1 != '\0') {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static ly_bool
node_has_printable_meta(const struct lyd_node *node)
{
    struct lyd_meta *iter;

    if (!node->meta) {
        return 0;
    }

    LY_LIST_FOR(node->meta, iter) {
        if (lyd_metadata_should_print(iter)) {
            return 1;
        }
    }

    return 0;
}